

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

void mxx::scatter<int>(int *msgs,size_t size,int *out,int root,comm *comm)

{
  int iVar1;
  MPI_Datatype poVar2;
  MPI_Datatype poVar3;
  MPI_Comm poVar4;
  undefined1 local_48 [8];
  datatype dt;
  comm *comm_local;
  int root_local;
  int *out_local;
  size_t size_local;
  int *msgs_local;
  
  dt._16_8_ = comm;
  iVar1 = mxx::comm::size(comm);
  if (size * (long)iVar1 < 0x7fffffff) {
    get_datatype<int>();
    poVar2 = datatype::type((datatype *)local_48);
    poVar3 = datatype::type((datatype *)local_48);
    poVar4 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Scatter(msgs,size & 0xffffffff,poVar2,out,size & 0xffffffff,poVar3,root,poVar4);
    datatype::~datatype((datatype *)local_48);
  }
  else {
    impl::scatter_big<int>(msgs,size,out,root,(comm *)dt._16_8_);
  }
  return;
}

Assistant:

void scatter(const T* msgs, size_t size, T* out, int root, const mxx::comm& comm = mxx::comm())
{
    if (size*comm.size() >= mxx::max_int) {
        // own scatter for large messages
        impl::scatter_big(msgs, size, out, root, comm);
    } else {
        // regular implementation
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Scatter(const_cast<T*>(msgs), size, dt.type(),
                    out, size, dt.type(), root, comm);
    }
}